

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O3

void __thiscall mp::Error::Error(Error *this,CStringRef msg,int c)

{
  allocator<char> local_39;
  string local_38;
  
  std::runtime_error::runtime_error((runtime_error *)this,"");
  *(undefined ***)&this->super_RuntimeError = &PTR__SystemError_00445718;
  this->exit_code_ = c;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,msg.data_,&local_39);
  SetMessage(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Error(fmt::CStringRef msg, int c=-1) : exit_code_(c)
  { SetMessage(msg.c_str()); }